

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_AY_Stereo(VGMPlayer *this)

{
  CHIP_DEVICE *pCVar1;
  code *pcStack_30;
  UINT8 retVal;
  DEVFUNC_OPTMASK writeStMask;
  VGM_BASEDEV *clDev;
  CHIP_DEVICE *cDev;
  UINT8 chipID;
  VGMPlayer *pVStack_10;
  UINT8 chipType;
  VGMPlayer *this_local;
  
  cDev._7_1_ = '\x12';
  if ((this->_fileData[(ulong)this->_filePos + 1] & 0x40) != 0) {
    cDev._7_1_ = '\x06';
  }
  cDev._6_1_ = (UINT8)((int)(this->_fileData[(ulong)this->_filePos + 1] & 0x80) >> 7);
  pVStack_10 = this;
  clDev = &GetDevicePtr(this,cDev._7_1_,cDev._6_1_)->base;
  pcStack_30 = (code *)0x0;
  if ((CHIP_DEVICE *)clDev != (CHIP_DEVICE *)0x0) {
    pCVar1 = (CHIP_DEVICE *)clDev;
    if ((cDev._7_1_ != '\x12') && (pCVar1 = (CHIP_DEVICE *)writeStMask, cDev._7_1_ == '\x06')) {
      pCVar1 = (CHIP_DEVICE *)(((CHIP_DEVICE *)clDev)->base).linkDev;
    }
    writeStMask = (DEVFUNC_OPTMASK)pCVar1;
    if ((writeStMask != (DEVFUNC_OPTMASK)0x0) &&
       (SndEmu_GetDeviceFunc
                  (*(DEV_DEF **)(writeStMask + 0x10),'\0','\x01',0x5354,&stack0xffffffffffffffd0),
       pcStack_30 != (code *)0x0)) {
      (*pcStack_30)((clDev->defInf).dataPtr,this->_fileData[(ulong)this->_filePos + 1] & 0x3f);
    }
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_AY_Stereo(void)
{
	UINT8 chipType = (fData[0x01] & 0x40) ? 0x06 : 0x12;	// YM2203 SSG or AY8910
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	VGM_BASEDEV* clDev;
	DEVFUNC_OPTMASK writeStMask = NULL;
	UINT8 retVal;
	
	if (cDev == NULL)
		return;
	if (chipType == 0x12)	// AY8910
		clDev = &cDev->base;
	else if (chipType == 0x06)	// YM2203 SSG
		clDev = cDev->base.linkDev;
	if (clDev == NULL)
		return;
	
	retVal = SndEmu_GetDeviceFunc(clDev->defInf.devDef, RWF_REGISTER | RWF_WRITE, DEVRW_ALL, 0x5354, (void**)&writeStMask);
	if (writeStMask != NULL)
		writeStMask(cDev->base.defInf.dataPtr, fData[0x01] & 0x3F);
	return;
}